

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheVk::AssignDescriptorSetAllocation
          (ShaderResourceCacheVk *this,Uint32 SetIndex,DescriptorSetAllocation *Allocation)

{
  DescriptorSet *pDVar1;
  string msg;
  string local_38;
  
  pDVar1 = GetDescriptorSet(this,SetIndex);
  if (pDVar1->m_NumResources == 0) {
    FormatString<char[24]>(&local_38,(char (*) [24])"Descriptor set is empty");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AssignDescriptorSetAllocation",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0xc6);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((pDVar1->m_DescriptorSetAllocation).Set != (VkDescriptorSet)0x0) {
    FormatString<char[55]>
              (&local_38,(char (*) [55])"Descriptor set allocation has already been initialized");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AssignDescriptorSetAllocation",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,199);
    std::__cxx11::string::~string((string *)&local_38);
  }
  DescriptorSetAllocation::operator=(&pDVar1->m_DescriptorSetAllocation,Allocation);
  return;
}

Assistant:

void AssignDescriptorSetAllocation(Uint32 SetIndex, DescriptorSetAllocation&& Allocation)
    {
        DescriptorSet& DescrSet = GetDescriptorSet(SetIndex);
        VERIFY(DescrSet.GetSize() > 0, "Descriptor set is empty");
        VERIFY(!DescrSet.m_DescriptorSetAllocation, "Descriptor set allocation has already been initialized");
        DescrSet.m_DescriptorSetAllocation = std::move(Allocation);
    }